

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int PAL_setvbuf(PAL_FILE *f,char *buf,int type,size_t size)

{
  int iVar1;
  INT nRetVal;
  size_t size_local;
  int type_local;
  char *buf_local;
  PAL_FILE *f_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (f == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_setvbuf",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x3c0);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  iVar1 = setvbuf((FILE *)f->bsdFilePtr,buf,type,size);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
_cdecl
PAL_setvbuf(PAL_FILE *f, char *buf, int type, size_t size)
{
    INT nRetVal = 0;

    PERF_ENTRY(setvbuf);
    ENTRY( "setvbuf( %p, %p, %d, %ul )\n", f, buf, type, size);

    _ASSERTE(f != NULL);

    nRetVal = setvbuf(f->bsdFilePtr, buf, type, size);

    LOGEXIT( "setvbuf returning %d\n", nRetVal );
    PERF_EXIT(setvbuf);
    return nRetVal;
}